

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::compute_zeroth_persistence
          (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,unsigned_short min_dimension,unsigned_short param_3)

{
  bool bVar1;
  uint uVar2;
  index_t iVar3;
  ostream *poVar4;
  size_t sVar5;
  pair<float,_int> *ppVar6;
  float *pfVar7;
  void *this_00;
  ushort in_SI;
  undefined8 *in_RDI;
  value_t vVar8;
  int in_stack_0000008c;
  directed_flag_complex_in_memory_computer_t *in_stack_00000090;
  index_t index_1;
  value_t f;
  value_t filtration_v;
  value_t filtration_u;
  index_t v;
  index_t u;
  pair<unsigned_short,_unsigned_short> vertices;
  filtration_index_t e;
  iterator __end2;
  iterator __begin2;
  vector<filtration_index_t,_std::allocator<filtration_index_t>_> *__range2;
  value_t filtration;
  index_t index;
  index_t number_of_edges;
  vector<filtration_index_t,_std::allocator<filtration_index_t>_> edges;
  filtered_union_find dset;
  size_t n;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> birth_death;
  longlong betti_number;
  directed_flag_complex_in_memory_computer_t *in_stack_fffffffffffffd48;
  directed_flag_complex_in_memory_computer_t *in_stack_fffffffffffffd50;
  directed_flag_complex_in_memory_computer_t *in_stack_fffffffffffffd58;
  filtered_union_find *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*>
  *in_stack_fffffffffffffda0;
  long *plVar9;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  filtered_union_find *in_stack_fffffffffffffdb0;
  value_t local_218;
  int local_1b0;
  value_t local_138;
  value_t local_134;
  uint local_130;
  uint local_12c;
  pair<float,_int> local_128;
  pair<unsigned_short,_unsigned_short> local_11c;
  pair<float,_int> local_118;
  filtration_index_t *local_110;
  __normal_iterator<filtration_index_t_*,_std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>_>
  local_108;
  undefined1 *local_100;
  undefined1 local_f0 [8];
  undefined1 local_e8 [12];
  pair<float,_int> local_dc;
  filtration_index_t local_d4;
  value_t local_cc;
  int local_c8;
  int local_c4;
  undefined1 local_c0 [64];
  filtered_union_find local_80;
  size_t local_38;
  size_t local_18;
  ushort local_a;
  
  local_a = in_SI;
  directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
  prepare_next_dimension(in_stack_00000090,in_stack_0000008c);
  if (local_a < 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar4 = std::operator<<(poVar4,"computing persistent homology in dimension 0");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    std::operator<<(poVar4,"\r");
    local_18 = 0;
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::vector
              ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
               0x1e334a);
    local_38 = directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t
               ::number_of_cells(in_stack_fffffffffffffd50,
                                 (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
    vertex_filtration(in_stack_fffffffffffffd48);
    filtered_union_find::filtered_union_find
              (in_stack_fffffffffffffdb0,
               (vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd60);
    std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::vector
              ((vector<filtration_index_t,_std::allocator<filtration_index_t>_> *)0x1e33b2);
    sVar5 = directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
            number_of_cells(in_stack_fffffffffffffd50,
                            (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    local_c4 = (int)sVar5;
    for (local_c8 = 0; local_c8 < local_c4; local_c8 = local_c8 + 1) {
      local_cc = directed_flag_complex_in_memory_computer::
                 directed_flag_complex_in_memory_computer_t::filtration
                           (in_stack_fffffffffffffd58,
                            (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                            (index_t)in_stack_fffffffffffffd50);
      if (local_cc <= *(float *)(in_RDI + 2)) {
        local_dc = std::make_pair<float&,int&>((float *)in_stack_fffffffffffffd48,(int *)0x1e345a);
        filtration_index_t::filtration_index_t(&local_d4,local_dc);
        std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::push_back
                  ((vector<filtration_index_t,_std::allocator<filtration_index_t>_> *)
                   in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
      }
    }
    std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::rbegin
              ((vector<filtration_index_t,_std::allocator<filtration_index_t>_> *)
               in_stack_fffffffffffffd58);
    std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::rend
              ((vector<filtration_index_t,_std::allocator<filtration_index_t>_> *)
               in_stack_fffffffffffffd58);
    std::
    sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<filtration_index_t*,std::vector<filtration_index_t,std::allocator<filtration_index_t>>>>,greater_filtration_or_smaller_index<filtration_index_t>>
              (local_e8,local_f0);
    (**(code **)(*(long *)in_RDI[1] + 0x28))((long *)in_RDI[1],0);
    local_100 = local_c0;
    local_108._M_current =
         (filtration_index_t *)
         std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::begin
                   ((vector<filtration_index_t,_std::allocator<filtration_index_t>_> *)
                    in_stack_fffffffffffffd48);
    local_110 = (filtration_index_t *)
                std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::end
                          ((vector<filtration_index_t,_std::allocator<filtration_index_t>_> *)
                           in_stack_fffffffffffffd48);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<filtration_index_t_*,_std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>_>
                               *)in_stack_fffffffffffffd50,
                              (__normal_iterator<filtration_index_t_*,_std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>_>
                               *)in_stack_fffffffffffffd48), bVar1) {
      ppVar6 = &__gnu_cxx::
                __normal_iterator<filtration_index_t_*,_std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>_>
                ::operator*(&local_108)->super_pair<float,_int>;
      local_128 = *ppVar6;
      local_118 = local_128;
      get_index((filtration_index_t)local_128);
      local_11c = directed_flag_complex_in_memory_computer::
                  directed_flag_complex_in_memory_computer_t::vertices_of_edge
                            (in_stack_fffffffffffffd58,
                             (index_t)((ulong)in_stack_fffffffffffffd50 >> 0x20));
      local_12c = filtered_union_find::find
                            (in_stack_fffffffffffffd60,
                             (index_t)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      local_130 = filtered_union_find::find
                            (in_stack_fffffffffffffd60,
                             (index_t)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      if (local_12c == local_130) {
        std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::push_back
                  ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)
                   in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
      }
      else {
        local_134 = directed_flag_complex_in_memory_computer::
                    directed_flag_complex_in_memory_computer_t::filtration
                              (in_stack_fffffffffffffd58,
                               (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                               (index_t)in_stack_fffffffffffffd50);
        local_138 = directed_flag_complex_in_memory_computer::
                    directed_flag_complex_in_memory_computer_t::filtration
                              (in_stack_fffffffffffffd58,
                               (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                               (index_t)in_stack_fffffffffffffd50);
        filtered_union_find::link(&local_80,(char *)(ulong)local_12c,(char *)(ulong)local_130);
        if (local_a == 0) {
          vVar8 = get_filtration((filtration_index_t)local_118);
          pfVar7 = std::max<float>(&local_134,&local_138);
          if (*pfVar7 <= vVar8 && vVar8 != *pfVar7) {
            uVar2 = filtered_union_find::find
                              (in_stack_fffffffffffffd60,
                               (index_t)((ulong)in_stack_fffffffffffffd58 >> 0x20));
            if (uVar2 == local_12c) {
              local_218 = local_138;
            }
            else {
              local_218 = local_134;
            }
            plVar9 = (long *)in_RDI[1];
            vVar8 = get_filtration((filtration_index_t)local_118);
            (**(code **)(*plVar9 + 0x30))(local_218,vVar8);
            get_filtration((filtration_index_t)local_118);
            std::make_pair<float_const&,float>((float *)in_stack_fffffffffffffd48,(float *)0x1e388c)
            ;
            std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
            push_back((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                      in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<filtration_index_t_*,_std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>_>
      ::operator++(&local_108);
    }
    std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::begin
              ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)
               in_stack_fffffffffffffd48);
    std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::end
              ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)
               in_stack_fffffffffffffd48);
    std::reverse<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>>
              (in_stack_fffffffffffffda0,
               (_Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    if (local_a != 1) {
      for (local_1b0 = 0; local_1b0 < (int)local_38; local_1b0 = local_1b0 + 1) {
        iVar3 = filtered_union_find::find
                          (in_stack_fffffffffffffd60,
                           (index_t)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        if (iVar3 == local_1b0) {
          plVar9 = (long *)in_RDI[1];
          vVar8 = directed_flag_complex_in_memory_computer::
                  directed_flag_complex_in_memory_computer_t::filtration
                            (in_stack_fffffffffffffd58,
                             (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                             (index_t)in_stack_fffffffffffffd50);
          (**(code **)(*plVar9 + 0x38))(vVar8);
          local_18 = local_18 + 1;
          directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
          filtration(in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                     (index_t)in_stack_fffffffffffffd50);
          std::numeric_limits<float>::infinity();
          std::make_pair<float,float>((float *)in_stack_fffffffffffffd48,(float *)0x1e3a44);
          std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::push_back
                    ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                     in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd50,
                 (value_type_conflict3 *)in_stack_fffffffffffffd48);
      std::
      vector<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
      ::push_back((vector<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
                   *)in_stack_fffffffffffffd60,(value_type *)in_stack_fffffffffffffd58);
      directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
      computation_result((directed_flag_complex_in_memory_computer_t *)*in_RDI,0,local_18,0);
      (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_18,0);
      if ((*(byte *)((long)in_RDI + 0x24) & 1) != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        poVar4 = std::operator<<(poVar4,"The dimensions of the mod-");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(short *)((long)in_RDI + 0x26));
        poVar4 = std::operator<<(poVar4," homology of the full complex are:");
        in_stack_fffffffffffffd60 =
             (filtered_union_find *)
             std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (in_stack_fffffffffffffd60,std::endl<char,std::char_traits<char>>);
        in_stack_fffffffffffffd50 =
             (directed_flag_complex_in_memory_computer_t *)std::operator<<(poVar4,"dim H_0 = ");
        this_00 = (void *)std::ostream::operator<<(in_stack_fffffffffffffd50,local_18);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      *(int *)(in_RDI + 4) = (int)local_18 + *(int *)(in_RDI + 4);
    }
    std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::~vector
              ((vector<filtration_index_t,_std::allocator<filtration_index_t>_> *)
               in_stack_fffffffffffffd60);
    filtered_union_find::~filtered_union_find((filtered_union_find *)in_stack_fffffffffffffd50);
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::~vector
              ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
               in_stack_fffffffffffffd60);
  }
  return;
}

Assistant:

void compute_zeroth_persistence(unsigned short min_dimension, unsigned short) {
		complex.prepare_next_dimension(0);

		// Only compute this if we actually need it
		if (min_dimension > 1) return;

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing persistent homology in dimension 0" << std::flush << "\r";
#endif

		long long betti_number = 0;
#ifdef RETRIEVE_PERSISTENCE
		std::vector<std::pair<value_t, value_t>> birth_death;
#endif
		size_t n = complex.number_of_cells(0);
		filtered_union_find dset(complex.vertex_filtration());
		std::vector<filtration_index_t> edges;
		index_t number_of_edges = index_t(complex.number_of_cells(1));
		for (index_t index = 0; index < number_of_edges; index++) {
			value_t filtration = complex.filtration(1, index);
			if (filtration <= max_filtration) edges.push_back(std::make_pair(filtration, index));
		}
		std_algorithms::sort(edges.rbegin(), edges.rend(), greater_filtration_or_smaller_index<filtration_index_t>());

		// Let the output class know that we are now computing zeroth degree barcodes
		output->computing_barcodes_in_dimension(0);

		for (auto e : edges) {
			const auto vertices = complex.vertices_of_edge(get_index(e));
			index_t u = dset.find(vertices.first), v = dset.find(vertices.second);

			if (u != v) {
				// Only output bars if we are interested in zeroth homology
				const auto filtration_u = complex.filtration(0, u);
				const auto filtration_v = complex.filtration(0, v);
				dset.link(u, v);
				if (min_dimension == 0 && get_filtration(e) > std::max(filtration_u, filtration_v)) {
					// Check which vertex is merged into which other vertex.
					const auto f = dset.find(u) == u ? filtration_v : filtration_u;
					output->new_barcode(f, get_filtration(e));
#ifdef RETRIEVE_PERSISTENCE
					birth_death.push_back(std::make_pair(f, get_filtration(e)));
#endif
				}
			} else {
				columns_to_reduce.push_back(e);
			}
		}
		std::reverse(columns_to_reduce.begin(), columns_to_reduce.end());

		// If we don't care about zeroth homology, then we can stop here
		if (min_dimension == 1) return;

		for (index_t index = 0; index < index_t(n); ++index) {
			if (dset.find(index) == index) {
				output->new_infinite_barcode(complex.filtration(0, index));
				betti_number++;
#ifdef RETRIEVE_PERSISTENCE
				birth_death.push_back(
				    std::make_pair(complex.filtration(0, index), std::numeric_limits<value_t>::infinity()));
#endif
			}
		}

#ifdef RETRIEVE_PERSISTENCE
		betti_numbers.push_back(betti_number);
		birth_deaths_by_dim.push_back(birth_death);
#endif
		// Report the betti number back to the complex and the output
		complex.computation_result(0, betti_number, 0);
		output->betti_number(betti_number, 0);

		if (print_betti_numbers_to_console) {
			std::cout << "\033[K"
			          << "The dimensions of the mod-" << modulus << " homology of the full complex are:" << std::endl
			          << std::endl
			          << "dim H_0 = " << betti_number << std::endl;
		}
		euler_characteristic += index_t(betti_number);
	}